

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc-type-utils.h
# Opt level: O1

EvaluationResult wasm::GCTypeUtils::evaluateCastCheck(Type refType,Type castType)

{
  bool bVar1;
  uint uVar2;
  HeapType HVar3;
  HeapType HVar4;
  Type TVar5;
  Type TVar6;
  EvaluationResult EVar7;
  HeapType local_48;
  Type local_40;
  Type local_38;
  Type castType_local;
  Type refType_local;
  
  if (((refType.id & 1) == 0 && 6 < refType.id) && (6 < castType.id && (castType.id & 1) == 0)) {
    local_38.id = castType.id;
    castType_local.id = refType.id;
    refType_local.id = refType.id;
    if ((((refType.id & 2) == 0) &&
        (HVar3 = wasm::Type::getHeapType(&refType_local), HVar3.id < 0x7d)) &&
       (uVar2 = (uint)HVar3.id & 0x7b, (uVar2 << 0x1d | uVar2 - 8 >> 3) - 10 < 5)) {
      return Unreachable;
    }
    HVar3 = wasm::Type::getHeapType(&castType_local);
    if ((0x7c < HVar3.id || ((local_38.id & 3) != 0 || local_38.id < 7)) ||
       (uVar2 = (uint)HVar3.id & 0x7b, EVar7 = Failure, 4 < (uVar2 << 0x1d | uVar2 - 8 >> 3) - 10))
    {
      HVar3 = wasm::Type::getHeapType(&local_38);
      refType_local = castType_local;
      local_40.id = local_38.id;
      HVar4 = wasm::Type::getHeapType(&refType_local);
      if (0x7c < HVar4.id) {
        local_48 = wasm::Type::getHeapType(&refType_local);
        bVar1 = HeapType::isOpen(&local_48);
        if (!bVar1) {
          refType_local = wasm::Type::with(&refType_local,Exact);
        }
      }
      TVar5 = wasm::Type::with(&refType_local,NonNullable);
      TVar6 = wasm::Type::with(&local_40,NonNullable);
      bVar1 = wasm::Type::isSubType(TVar5,TVar6);
      if (bVar1) {
        EVar7 = Success;
        if ((local_38.id < 7 || ((uint)local_38.id & 3) != 2) &&
           (castType_local.id < 7 || (castType_local.id & 3) != 0)) {
          if ((castType_local.id < 7) || ((int)(castType_local.id & 3) != 2)) {
            __assert_fail("refType.isNullable()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/gc-type-utils.h"
                          ,0x85,"EvaluationResult wasm::GCTypeUtils::evaluateCastCheck(Type, Type)")
            ;
          }
          if ((local_38.id < 7) || (EVar7 = SuccessOnlyIfNonNull, (local_38.id & 3) != 0)) {
            __assert_fail("castType.isNonNullable()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/gc-type-utils.h"
                          ,0x86,"EvaluationResult wasm::GCTypeUtils::evaluateCastCheck(Type, Type)")
            ;
          }
        }
      }
      else {
        refType_local.id = local_38.id;
        local_40.id = castType_local.id;
        HVar4 = wasm::Type::getHeapType(&refType_local);
        if (0x7c < HVar4.id) {
          local_48 = wasm::Type::getHeapType(&refType_local);
          bVar1 = HeapType::isOpen(&local_48);
          if (!bVar1) {
            refType_local = wasm::Type::with(&refType_local,Exact);
          }
        }
        TVar5 = wasm::Type::with(&refType_local,NonNullable);
        TVar6 = wasm::Type::with(&local_40,NonNullable);
        bVar1 = wasm::Type::isSubType(TVar5,TVar6);
        if (((!bVar1) ||
            ((EVar7 = Unknown, HVar3.id < 0x7d &&
             (uVar2 = (uint)HVar3.id & 0x7b, EVar7 = Unknown,
             (uVar2 << 0x1d | uVar2 - 8 >> 3) - 10 < 5)))) &&
           (EVar7 = Failure, castType_local.id < 7 || (castType_local.id & 3) != 0)) {
          EVar7 = ((local_38.id & 3) == 0 && 6 < local_38.id) ^ SuccessOnlyIfNull;
        }
      }
    }
  }
  else {
    EVar7 = (uint)(refType.id == 1) * 5;
  }
  return EVar7;
}

Assistant:

inline EvaluationResult evaluateCastCheck(Type refType, Type castType) {
  if (!refType.isRef() || !castType.isRef()) {
    if (refType == Type::unreachable) {
      return Unreachable;
    }
    // If the cast type is unreachable, we can't tell - perhaps this is a br
    // instruction of some kind, that has unreachable type normally.
    return Unknown;
  }

  if (isUninhabitable(refType)) {
    // No value can appear in the ref, so the cast cannot be reached.
    return Unreachable;
  }

  auto refHeapType = refType.getHeapType();

  if (castType.isNonNullable() && refHeapType.isBottom()) {
    // Non-null references to bottom types do not exist, so there's no value
    // that could make the cast succeed.
    //
    // Note that there is an interesting corner case that is relevant here: if
    // the ref type is uninhabitable, say (ref nofunc), and the cast type is
    // non-nullable, say (ref func), then we have two contradictory rules that
    // seem to apply:
    //
    //  * A non-nullable cast of a bottom type must fail.
    //  * A cast of a subtype must succeed.
    //
    // In practice the uninhabitable type means that the cast is not even
    // reached, which is why there is no contradiction here. To avoid ambiguity,
    // we already checked for uninhabitability earlier, and returned
    // Unreachable.
    return Failure;
  }

  auto castHeapType = castType.getHeapType();

  // Check whether a value of type `a` is known to also have type `b`, assuming
  // it is non-null.
  auto isHeapSubtype = [](Type a, Type b) {
    // If the heap type of `a` has no subtypes, then we know its value must be
    // exactly `a`.
    // TODO: Use information from a subtypes analysis, if available.
    if (!a.getHeapType().isBasic() && !a.getHeapType().isOpen()) {
      a = a.with(Exact);
    }
    // Ignore nullability.
    return Type::isSubType(a.with(NonNullable), b.with(NonNullable));
  };

  auto refIsHeapSubType = isHeapSubtype(refType, castType);

  if (refIsHeapSubType) {
    // The heap type is a subtype. All we need is for nullability to work out as
    // well, and then the cast must succeed.
    if (castType.isNullable() || refType.isNonNullable()) {
      return Success;
    }

    // If the heap type part of the cast is compatible but the cast as a whole
    // is not, we must have a nullable input ref that we are casting to a
    // non-nullable type.
    assert(refType.isNullable());
    assert(castType.isNonNullable());
    return SuccessOnlyIfNonNull;
  }

  auto castIsHeapSubType = isHeapSubtype(castType, refType);
  bool heapTypesCompatible = refIsHeapSubType || castIsHeapSubType;

  if (!heapTypesCompatible || castHeapType.isBottom()) {
    // If the heap types are incompatible or if it is impossible to have a
    // non-null reference to the target heap type, then the only way the cast
    // can succeed is if it allows nulls and the input is null.
    //
    // Note that this handles uninhabitability of the cast type.
    if (refType.isNonNullable() || castType.isNonNullable()) {
      return Failure;
    }

    // Both are nullable. A null is the only hope of success in either
    // situation.
    return SuccessOnlyIfNull;
  }

  return Unknown;
}